

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O2

base_learner * svrg_setup(options_i *options,vw *all)

{
  option_group_definition *this;
  typed_option<int> *op;
  learner<SVRG::svrg,_example> *plVar1;
  uint32_t *puVar2;
  bool svrg_option;
  allocator local_24c;
  allocator local_24b;
  allocator local_24a;
  allocator local_249;
  free_ptr<SVRG::svrg> s;
  string local_238 [32];
  string local_218;
  string local_1f8 [32];
  string local_1d8;
  string local_1b8;
  option_group_definition new_options;
  undefined1 local_160 [112];
  bool local_f0;
  typed_option<int> local_c0;
  
  scoped_calloc_or_throw<SVRG::svrg>();
  svrg_option = false;
  std::__cxx11::string::string
            ((string *)&local_1b8,"Stochastic Variance Reduced Gradient",(allocator *)local_160);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::string((string *)&local_1d8,"svrg",&local_249);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_160,&local_1d8,&svrg_option);
  local_f0 = true;
  std::__cxx11::string::string
            (local_1f8,"Streaming Stochastic Variance Reduced Gradient",&local_24a);
  std::__cxx11::string::_M_assign((string *)(local_160 + 0x30));
  this = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                   (&new_options,(typed_option<bool> *)local_160);
  std::__cxx11::string::string((string *)&local_218,"stage_size",&local_24b);
  VW::config::typed_option<int>::typed_option
            (&local_c0,&local_218,
             &(s._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl)->stage_size);
  op = VW::config::typed_option<int>::default_value(&local_c0,1);
  std::__cxx11::string::string(local_238,"Number of passes per SVRG stage",&local_24c);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>(this,op);
  std::__cxx11::string::~string(local_238);
  VW::config::typed_option<int>::~typed_option(&local_c0);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string(local_1f8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_160);
  std::__cxx11::string::~string((string *)&local_1d8);
  (**options->_vptr_options_i)(options,&new_options);
  if (svrg_option == false) {
    plVar1 = (learner<SVRG::svrg,_example> *)0x0;
  }
  else {
    (s._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl)->all = all;
    (s._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl)->prev_pass = -1;
    (s._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl)->stable_grad_count = 0;
    parameters::stride_shift(&all->weights,2);
    puVar2 = &(all->weights).dense_weights._stride_shift;
    if ((all->weights).sparse != false) {
      puVar2 = &(all->weights).sparse_weights._stride_shift;
    }
    plVar1 = LEARNER::init_learner<SVRG::svrg,example,LEARNER::learner<char,example>>
                       (&s,SVRG::learn,SVRG::predict,1L << ((byte)*puVar2 & 0x3f));
    *(code **)(plVar1 + 0x80) = SVRG::save_load;
    *(undefined8 *)(plVar1 + 0x70) = *(undefined8 *)(plVar1 + 0x18);
    *(undefined8 *)(plVar1 + 0x78) = *(undefined8 *)(plVar1 + 0x20);
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<SVRG::svrg,_void_(*)(void_*)>::~unique_ptr(&s);
  return (base_learner *)plVar1;
}

Assistant:

base_learner* svrg_setup(options_i& options, vw& all)
{
  auto s = scoped_calloc_or_throw<svrg>();

  bool svrg_option = false;
  option_group_definition new_options("Stochastic Variance Reduced Gradient");
  new_options.add(make_option("svrg", svrg_option).keep().help("Streaming Stochastic Variance Reduced Gradient"))
      .add(make_option("stage_size", s->stage_size).default_value(1).help("Number of passes per SVRG stage"));
  options.add_and_parse(new_options);

  if (!svrg_option)
  {
    return nullptr;
  }

  s->all = &all;
  s->prev_pass = -1;
  s->stable_grad_count = 0;

  // Request more parameter storage (4 floats per feature)
  all.weights.stride_shift(2);
  learner<svrg, example>& l = init_learner(s, learn, predict, UINT64_ONE << all.weights.stride_shift());
  l.set_save_load(save_load);
  return make_base(l);
}